

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.h
# Opt level: O0

LookupResponse * __thiscall Future<LookupResponse>::get(Future<LookupResponse> *this)

{
  bool bVar1;
  element_type *peVar2;
  long in_RSI;
  LookupResponse *in_RDI;
  LookupResponse *in_stack_ffffffffffffff78;
  LookupResponse *this_00;
  LookupResponse local_68 [104];
  
  this_00 = in_RDI;
  if (((*(byte *)(in_RSI + 0x70) & 1) == 0) &&
     (bVar1 = std::operator!=((shared_ptr<AsyncTask<LookupResponse>_> *)in_RDI,
                              in_stack_ffffffffffffff78), bVar1)) {
    peVar2 = std::
             __shared_ptr_access<AsyncTask<LookupResponse>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<AsyncTask<LookupResponse>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x116de7);
    (**peVar2->_vptr_AsyncTask)(local_68);
    LookupResponse::operator=(this_00,in_stack_ffffffffffffff78);
    LookupResponse::~LookupResponse(local_68);
    *(undefined1 *)(in_RSI + 0x70) = 1;
  }
  LookupResponse::LookupResponse(this_00,in_stack_ffffffffffffff78);
  return in_RDI;
}

Assistant:

virtual T get() {
    if (!is_done_ && task_ != nullptr) {
      result_ = task_->get();
      is_done_ = true;
    }
    return result_;
  }